

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O1

void __thiscall Assimp::Discreet3DSExporter::WriteColor(Discreet3DSExporter *this,aiColor3D *color)

{
  StreamWriterLE *this_00;
  ChunkWriter chunk;
  ChunkWriter local_20;
  
  this_00 = &this->writer;
  local_20.chunk_start_pos = (this->writer).cursor;
  local_20.writer = this_00;
  StreamWriter<false,_false>::Put<unsigned_short>(this_00,0x10);
  StreamWriter<false,_false>::Put<unsigned_int>(this_00,0xdeadbeef);
  StreamWriter<false,_false>::Put<float>(this_00,color->r);
  StreamWriter<false,_false>::Put<float>(this_00,color->g);
  StreamWriter<false,_false>::Put<float>(this_00,color->b);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&local_20);
  return;
}

Assistant:

void Discreet3DSExporter::WriteColor(const aiColor3D& color) {
    ChunkWriter chunk(writer, Discreet3DS::CHUNK_RGBF);
    writer.PutF4(color.r);
    writer.PutF4(color.g);
    writer.PutF4(color.b);
}